

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O1

void Assimp::Bitmap::WriteDIB(DIB *dib,IOStream *file)

{
  uint8_t data [40];
  uint32_t local_28;
  int32_t local_24;
  int32_t local_20;
  uint16_t local_1c;
  uint16_t local_1a;
  uint32_t local_18;
  uint32_t local_14;
  int32_t local_10;
  int32_t local_c;
  uint32_t local_8;
  uint32_t local_4;
  
  local_28 = dib->size;
  local_24 = dib->width;
  local_20 = dib->height;
  local_1c = dib->planes;
  local_1a = dib->bits_per_pixel;
  local_18 = dib->compression;
  local_14 = dib->image_size;
  local_10 = dib->x_resolution;
  local_c = dib->y_resolution;
  local_8 = dib->nb_colors;
  local_4 = dib->nb_important_colors;
  (*file->_vptr_IOStream[3])(file,&local_28,0x28,1);
  return;
}

Assistant:

void Bitmap::WriteDIB(DIB& dib, IOStream* file) {
        uint8_t data[DIB::dib_size];

        std::size_t offset = 0;

        offset += Copy(&data[offset], dib.size);
        offset += Copy(&data[offset], dib.width);
        offset += Copy(&data[offset], dib.height);
        offset += Copy(&data[offset], dib.planes);
        offset += Copy(&data[offset], dib.bits_per_pixel);
        offset += Copy(&data[offset], dib.compression);
        offset += Copy(&data[offset], dib.image_size);
        offset += Copy(&data[offset], dib.x_resolution);
        offset += Copy(&data[offset], dib.y_resolution);
        offset += Copy(&data[offset], dib.nb_colors);
                  Copy(&data[offset], dib.nb_important_colors);

        file->Write(data, DIB::dib_size, 1);
    }